

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int.cpp
# Opt level: O0

string * Lib::Int::toString_abi_cxx11_(long l)

{
  undefined8 in_RSI;
  string *in_RDI;
  char tmp [256];
  int BUFSIZE;
  string *result;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar1;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  
  snprintf(&stack0xfffffffffffffee8,0x100,"%ld",in_RSI);
  uVar1 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffee0));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee6);
  return in_RDI;
}

Assistant:

std::string Int::toString(long l)
{
  constexpr auto BUFSIZE = 256;
  char tmp [BUFSIZE];
  snprintf(tmp,BUFSIZE,"%ld",l);
  std::string result(tmp);

  return result;
}